

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DataType dataType)

{
  long lVar1;
  char *pcVar2;
  uint uVar3;
  ostringstream source;
  undefined1 auStack_188 [376];
  ulong uVar4;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  uVar3 = (int)this - 0x2d;
  uVar4 = (ulong)uVar3;
  if (uVar3 < 0x2e) {
    if ((0x102041UL >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x70000000000U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x380000000000U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_0163cd56;
        lVar1 = 0x2b;
        pcVar2 = "GL_OES_texture_storage_multisample_2d_array";
      }
      else {
        lVar1 = 0x15;
        pcVar2 = "GL_EXT_texture_buffer";
      }
    }
    else {
      lVar1 = 0x1d;
      pcVar2 = "GL_EXT_texture_cube_map_array";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,pcVar2,lVar1);
  }
LAB_0163cd56:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string getDataTypeExtension (glu::DataType dataType)
{
	std::ostringstream source;
	switch (dataType)
	{
		case glu::TYPE_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW:
		case glu::TYPE_INT_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_CUBE_ARRAY:
			source << "GL_EXT_texture_cube_map_array";
			break;

		case glu::TYPE_SAMPLER_BUFFER:
		case glu::TYPE_INT_SAMPLER_BUFFER:
		case glu::TYPE_UINT_SAMPLER_BUFFER:
			source << "GL_EXT_texture_buffer";
			break;

		case glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY:
			source << "GL_OES_texture_storage_multisample_2d_array";
			break;

		default:
			break;
	}

	return source.str();
}